

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

RepeatedPtrField<google::protobuf::MessageLite> *
google::protobuf::Arena::
CreateMessageInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
          (Arena *arena)

{
  Arena *arena_local;
  
  if (arena == (Arena *)0x0) {
    arena_local = (Arena *)operator_new(0x18);
    RepeatedPtrField<google::protobuf::MessageLite>::RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::MessageLite> *)arena_local,(Arena *)0x0);
  }
  else {
    arena_local = (Arena *)DoCreateMessage<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                                     (arena);
  }
  return (RepeatedPtrField<google::protobuf::MessageLite> *)arena_local;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }